

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void sort_rd(int64_t *rds,int *txk,int len)

{
  int iVar1;
  int64_t iVar2;
  int tempi;
  int64_t temprd;
  int k;
  int j;
  int i;
  int len_local;
  int *txk_local;
  int64_t *rds_local;
  
  i = 1;
  do {
    if (len + -1 < i) {
      return;
    }
    j = 0;
    while( true ) {
      if (i <= j) goto LAB_0033774e;
      if (rds[i] < rds[j]) break;
      j = j + 1;
    }
    iVar2 = rds[i];
    iVar1 = txk[i];
    for (k = i; j < k; k = k + -1) {
      rds[k] = rds[k + -1];
      txk[k] = txk[k + -1];
    }
    rds[j] = iVar2;
    txk[j] = iVar1;
LAB_0033774e:
    i = i + 1;
  } while( true );
}

Assistant:

static inline void sort_rd(int64_t rds[], int txk[], int len) {
  int i, j, k;

  for (i = 1; i <= len - 1; ++i) {
    for (j = 0; j < i; ++j) {
      if (rds[j] > rds[i]) {
        int64_t temprd;
        int tempi;

        temprd = rds[i];
        tempi = txk[i];

        for (k = i; k > j; k--) {
          rds[k] = rds[k - 1];
          txk[k] = txk[k - 1];
        }

        rds[j] = temprd;
        txk[j] = tempi;
        break;
      }
    }
  }
}